

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O0

void __thiscall
TApp_IncorrectConstructionExcludesCannotFind_Test::TestBody
          (TApp_IncorrectConstructionExcludesCannotFind_Test *this)

{
  bool bVar1;
  Option *pOVar2;
  AssertHelper local_c8;
  Message local_c0 [2];
  IncorrectConstruction *anon_var_0;
  string local_a8;
  byte local_81;
  char *pcStack_80;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  string local_70;
  allocator local_39;
  string local_38;
  Option *local_18;
  Option *cat;
  TApp_IncorrectConstructionExcludesCannotFind_Test *this_local;
  
  cat = (Option *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"--cat",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"",(allocator *)((long)&gtest_msg.value + 7));
  pOVar2 = CLI::App::add_flag(&(this->super_TApp).app,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pOVar2;
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff80,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff80);
  if (bVar1) {
    local_81 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    pOVar2 = local_18;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_a8,"--nothing",(allocator *)((long)&anon_var_0 + 7));
      CLI::Option::excludes<CLI::App>(pOVar2,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
    }
    if ((local_81 & 1) != 0) {
      return;
    }
    pcStack_80 = 
    "Expected: cat->excludes(\"--nothing\") throws an exception of type CLI::IncorrectConstruction.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_c0);
  testing::internal::AssertHelper::AssertHelper
            (&local_c8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
             ,0xad,pcStack_80);
  testing::internal::AssertHelper::operator=(&local_c8,local_c0);
  testing::internal::AssertHelper::~AssertHelper(&local_c8);
  testing::Message::~Message(local_c0);
  return;
}

Assistant:

TEST_F(TApp, IncorrectConstructionExcludesCannotFind) {
    auto cat = app.add_flag("--cat");
    EXPECT_THROW(cat->excludes("--nothing"), CLI::IncorrectConstruction);
}